

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void rgb_gray_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                     JDIMENSION output_row,int num_rows)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  _func_void_j_compress_ptr *p_Var5;
  JSAMPROW pJVar6;
  JSAMPARRAY ppJVar7;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  INT32 *ctab;
  int b;
  int g;
  int r;
  my_cconvert_ptr cconvert;
  int num_rows_local;
  JDIMENSION output_row_local;
  JSAMPIMAGE output_buf_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  
  p_Var5 = cinfo->cconvert[1].start_pass;
  uVar4 = cinfo->image_width;
  num_rows_local = num_rows;
  output_row_local = output_row;
  input_buf_local = input_buf;
  while (num_rows_local = num_rows_local + -1, -1 < num_rows_local) {
    ppJVar7 = input_buf_local + 1;
    inptr = *input_buf_local;
    pJVar6 = (*output_buf)[output_row_local];
    output_row_local = output_row_local + 1;
    for (col = 0; input_buf_local = ppJVar7, col < uVar4; col = col + 1) {
      bVar3 = *inptr;
      pbVar1 = inptr + 1;
      pbVar2 = inptr + 2;
      inptr = inptr + 3;
      pJVar6[col] = (JSAMPLE)((ulong)(*(long *)(p_Var5 + (long)(int)(uint)bVar3 * 8) +
                                      *(long *)(p_Var5 + (long)(int)(*pbVar1 + 0x100) * 8) +
                                     *(long *)(p_Var5 + (long)(int)(*pbVar2 + 0x200) * 8)) >> 0x10);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_gray_convert (j_compress_ptr cinfo,
		  JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
		  JDIMENSION output_row, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int r, g, b;
  register INT32 * ctab = cconvert->rgb_ycc_tab;
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr = output_buf[0][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      r = GETJSAMPLE(inptr[RGB_RED]);
      g = GETJSAMPLE(inptr[RGB_GREEN]);
      b = GETJSAMPLE(inptr[RGB_BLUE]);
      inptr += RGB_PIXELSIZE;
      /* Y */
      outptr[col] = (JSAMPLE)
		((ctab[r+R_Y_OFF] + ctab[g+G_Y_OFF] + ctab[b+B_Y_OFF])
		 >> SCALEBITS);
    }
  }
}